

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mysimulator.cc
# Opt level: O3

void __thiscall brown::MySimulator::moveLinear(MySimulator *this,int dx,int dy,bool isDown)

{
  _Map_pointer pplVar1;
  _Elt_pointer plVar2;
  _Elt_pointer plVar3;
  int64_t *piVar4;
  uint uVar5;
  _Deque_base<long,_std::allocator<long>_> *p_Var6;
  _Deque_base<long,_std::allocator<long>_> *p_Var7;
  _Deque_base<long,_std::allocator<long>_> *p_Var8;
  _Deque_base<long,_std::allocator<long>_> *p_Var9;
  _Deque_base<long,_std::allocator<long>_> *p_Var10;
  int iVar11;
  long lVar12;
  int64_t iVar13;
  bool pulx;
  int iVar14;
  _Elt_pointer plVar15;
  _Deque_base<long,_std::allocator<long>_> *p_Var16;
  iterator *piVar17;
  long lVar18;
  uint uVar19;
  int iVar20;
  deque<long,std::allocator<long>> *this_00;
  long tt;
  int iVar21;
  stack<long,_std::deque<long,_std::allocator<long>_>_> vt2s;
  stack<long,_std::deque<long,_std::allocator<long>_>_> vt1s;
  int local_118;
  int local_114;
  long local_108;
  long local_100;
  float local_f4;
  uint local_f0;
  int local_ec;
  uint local_e8;
  uint local_e4;
  int64_t local_e0;
  _Deque_base<long,_std::allocator<long>_> local_d8;
  _Deque_base<long,_std::allocator<long>_> local_88;
  
  if (dy != 0 || dx != 0) {
    local_e4 = -dx;
    if (0 < dx) {
      local_e4 = dx;
    }
    local_e8 = -dy;
    if (0 < dy) {
      local_e8 = dy;
    }
    uVar19 = local_e8;
    if (local_e8 < local_e4) {
      uVar19 = local_e4;
    }
    uVar5 = local_e8;
    if (local_e4 < local_e8) {
      uVar5 = local_e4;
    }
    iVar14 = (this->super_Simulator).PULPERPIX;
    iVar20 = uVar19 * iVar14;
    iVar14 = iVar14 * uVar5;
    local_108 = 0;
    if (uVar5 == 0) {
      local_f4 = -1.0;
      local_108 = 0x7fffffffffffffff;
    }
    else {
      local_f4 = (float)iVar20 / (float)iVar14;
    }
    local_e0 = this->clk;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
    local_ec = dy;
    std::_Deque_base<long,_std::allocator<long>_>::_M_initialize_map(&local_88,0);
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
    local_d8._M_impl.super__Deque_impl_data._M_map_size = 0;
    std::_Deque_base<long,_std::allocator<long>_>::_M_initialize_map(&local_d8,0);
    local_f0 = (uint)isDown;
    if (0 < iVar14 || 0 < iVar20) {
      lVar18 = 0;
      local_118 = 0;
      local_114 = 0;
      do {
        iVar21 = iVar14;
        if (lVar18 <= local_108) {
          iVar21 = iVar20;
        }
        this_00 = (deque<long,std::allocator<long>> *)&local_d8;
        if (lVar18 <= local_108) {
          this_00 = (deque<long,std::allocator<long>> *)&local_88;
        }
        tt = local_108;
        if (lVar18 < local_108) {
          tt = lVar18;
        }
        pulx = lVar18 <= local_108 != local_e4 <= local_e8;
        this->clk = local_e0 + tt;
        Simulator::setpin(&this->super_Simulator,local_e0 + tt,pulx,!pulx,0 < dx,0 < local_ec,
                          SUB41(local_f0,0));
        iVar11 = local_118;
        if (lVar18 <= local_108) {
          iVar11 = local_114;
        }
        iVar11 = iVar11 + 1;
        if (local_108 < lVar18) {
          p_Var16 = &local_d8;
          p_Var6 = &local_d8;
          p_Var7 = &local_d8;
          p_Var8 = &local_d8;
          p_Var9 = &local_d8;
          p_Var10 = &local_d8;
          local_118 = iVar11;
          if (iVar11 < iVar14) goto LAB_00105d14;
          local_108 = 0x7fffffffffffffff;
        }
        else {
          p_Var16 = &local_88;
          p_Var6 = &local_88;
          p_Var7 = &local_88;
          p_Var8 = &local_88;
          p_Var9 = &local_88;
          p_Var10 = &local_88;
          local_114 = iVar11;
          if (iVar11 < iVar20) {
LAB_00105d14:
            piVar17 = &(p_Var16->_M_impl).super__Deque_impl_data._M_finish;
            pplVar1 = (p_Var7->_M_impl).super__Deque_impl_data._M_finish._M_node;
            local_100 = 0;
            plVar15 = piVar17->_M_cur;
            plVar2 = (p_Var9->_M_impl).super__Deque_impl_data._M_finish._M_first;
            plVar3 = (p_Var6->_M_impl).super__Deque_impl_data._M_start._M_cur;
            if (((long)(p_Var10->_M_impl).super__Deque_impl_data._M_start._M_last - (long)plVar3 >>
                3) + ((long)plVar15 - (long)plVar2 >> 3) +
                ((((ulong)((long)pplVar1 -
                          (long)(p_Var8->_M_impl).super__Deque_impl_data._M_start._M_node) >> 3) - 1
                 ) + (ulong)(pplVar1 == (_Map_pointer)0x0)) * 0x40 < (ulong)(long)(iVar21 - iVar11))
            {
              if (plVar15 != plVar3) {
                if (plVar15 == plVar2) {
                  plVar15 = pplVar1[-1] + 0x40;
                }
                lVar12 = (long)(this->super_Simulator).MINT;
                if (plVar15[-1] <= lVar12) goto LAB_00105e6f;
              }
              iVar13 = linearSpeedCurve(this,tt);
              local_100 = (long)(this->super_Simulator).MINT;
              if (local_100 < iVar13) {
                local_100 = iVar13;
              }
              p_Var16 = &local_d8;
              if (lVar18 <= local_108) {
                p_Var16 = &local_88;
              }
              piVar4 = piVar17->_M_cur;
              if (piVar4 == (p_Var16->_M_impl).super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<long,std::allocator<long>>::_M_push_back_aux<long_const&>
                          (this_00,&local_100);
                lVar12 = local_100;
              }
              else {
                *piVar4 = local_100;
                piVar17->_M_cur = piVar4 + 1;
                lVar12 = local_100;
              }
            }
            else {
              if (plVar15 == plVar2) {
                plVar15 = pplVar1[-1] + 0x40;
              }
              local_100 = plVar15[-1];
              std::deque<long,_std::allocator<long>_>::pop_back
                        ((deque<long,_std::allocator<long>_> *)this_00);
              lVar12 = local_100;
            }
LAB_00105e6f:
            local_100 = lVar12;
            if (local_108 < lVar18) {
              local_108 = local_108 + (long)((float)local_100 * local_f4);
            }
            else {
              lVar18 = lVar18 + local_100;
            }
          }
          else {
            lVar18 = 0x7fffffffffffffff;
          }
        }
      } while ((local_114 < iVar20) || (local_118 < iVar14));
    }
    lVar18 = (long)(this->super_Simulator).MAXT + this->clk;
    this->clk = lVar18;
    Simulator::setpin(&this->super_Simulator,lVar18,false,false,0 < dx,0 < local_ec,
                      SUB41(local_f0,0));
    std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_d8);
    std::_Deque_base<long,_std::allocator<long>_>::~_Deque_base(&local_88);
  }
  return;
}

Assistant:

void MySimulator::moveLinear(int dx, int dy, bool isDown) {
    if (dx == 0 && dy == 0) {
        return;
    }

    // direction and displacement
    bool dirx = (dx > 0);
    bool diry = (dy > 0);
    dx = std::abs(dx);
    dy = std::abs(dy);

    // determine primary/long and secondary/short axis
    bool isxmain = (dx > dy);
    int d1px = (isxmain ? dx : dy);
    int d2px = (isxmain ? dy : dx);
    bool d2is0 = (d2px == 0);

    // target steps and ratio
    int d1step = d1px * PULPERPIX;
    int d2step = d2px * PULPERPIX;
    float tg = d2is0? -1 : static_cast<float>(d1step)/d2step;

    // step keeping
    int s1 = 0;
    int s2 = 0;

    // time keeping
    std::int64_t startTick = clk;
    std::int64_t t1 = 0;
    std::int64_t t2 = d2is0 ? std::numeric_limits<std::int64_t>::max() : 0;

    // speed history
    std::stack<std::int64_t> vt1s;
    std::stack<std::int64_t> vt2s;

    while ((s1 < d1step) || (s2 < d2step)) {
        // determine driving axis
        bool ismain = (t1 <= t2);
        int& s = ismain ? s1 : s2;
        int dstep = ismain ? d1step : d2step;
        bool isx = (ismain == isxmain);
        std::int64_t& t = ismain ? t1 : t2;
        std::stack<std::int64_t>& vts = ismain ? vt1s : vt2s;

        // step
        clk = startTick + t;
        setpin(clk, isx, !isx, dirx, diry, isDown);
        if (++s >= dstep) {
            t = std::numeric_limits<std::int64_t>::max();
            continue;
        }

        // set next step interval
        std::int64_t vt = 0;
        if (vts.size() >= (dstep - s)) { // decelerate
            vt = vts.top();
            vts.pop();
        } else if (vts.empty() || (vts.top() > MINT)) { // accelerate
            vt = linearSpeedCurve(t);
            if (vt < MINT) { // speeding
                vt = MINT;
            }
            vts.push(vt);
        } else { // hold
            vt = MINT;
        }

        // adjust speed on secondary axis
        if (!ismain) {
            vt *= tg;
        }
        t += vt;
    }

    // delay, a time gap between line drawings
    clk += MAXT;
    setpin(clk, false, false, dirx, diry, isDown);
}